

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterEndDTD(xmlTextWriterPtr writer)

{
  bool bVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int local_20;
  int sum;
  int count;
  int loop;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    writer_local._4_4_ = -1;
  }
  else {
    lk._4_4_ = 0;
    bVar1 = true;
LAB_0021763d:
    while (((bVar1 && (lk_00 = xmlListFront(writer->nodes), lk_00 != (xmlLinkPtr)0x0)) &&
           (pvVar3 = xmlLinkGetData(lk_00), pvVar3 != (void *)0x0))) {
      switch(*(undefined4 *)((long)pvVar3 + 8)) {
      case 8:
        iVar2 = xmlOutputBufferWriteString(writer->out,"]");
        if (iVar2 < 0) {
          return -1;
        }
        lk._4_4_ = iVar2 + lk._4_4_;
      case 7:
        local_20 = xmlOutputBufferWriteString(writer->out,">");
        if (writer->indent != 0) {
          if (local_20 < 0) {
            return -1;
          }
          lk._4_4_ = local_20 + lk._4_4_;
          local_20 = xmlOutputBufferWriteString(writer->out,"\n");
        }
        xmlListPopFront(writer->nodes);
        break;
      case 9:
      case 10:
        local_20 = xmlTextWriterEndDTDElement(writer);
        break;
      case 0xb:
      case 0xc:
        local_20 = xmlTextWriterEndDTDAttlist(writer);
        break;
      case 0xd:
      case 0xe:
      case 0xf:
        local_20 = xmlTextWriterEndDTDEntity(writer);
        break;
      case 0x10:
        local_20 = xmlTextWriterEndComment(writer);
        break;
      default:
        goto switchD_002176a8_default;
      }
      if (local_20 < 0) {
        return -1;
      }
      lk._4_4_ = local_20 + lk._4_4_;
    }
    writer_local._4_4_ = lk._4_4_;
  }
  return writer_local._4_4_;
switchD_002176a8_default:
  bVar1 = false;
  goto LAB_0021763d;
}

Assistant:

int
xmlTextWriterEndDTD(xmlTextWriterPtr writer)
{
    int loop;
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    sum = 0;
    loop = 1;
    while (loop) {
        lk = xmlListFront(writer->nodes);
        if (lk == NULL)
            break;
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p == 0)
            break;
        switch (p->state) {
            case XML_TEXTWRITER_DTD_TEXT:
                count = xmlOutputBufferWriteString(writer->out, "]");
                if (count < 0)
                    return -1;
                sum += count;
                /* fallthrough */
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, ">");

                if (writer->indent) {
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                }

                xmlListPopFront(writer->nodes);
                break;
            case XML_TEXTWRITER_DTD_ELEM:
            case XML_TEXTWRITER_DTD_ELEM_TEXT:
                count = xmlTextWriterEndDTDElement(writer);
                break;
            case XML_TEXTWRITER_DTD_ATTL:
            case XML_TEXTWRITER_DTD_ATTL_TEXT:
                count = xmlTextWriterEndDTDAttlist(writer);
                break;
            case XML_TEXTWRITER_DTD_ENTY:
            case XML_TEXTWRITER_DTD_PENT:
            case XML_TEXTWRITER_DTD_ENTY_TEXT:
                count = xmlTextWriterEndDTDEntity(writer);
                break;
            case XML_TEXTWRITER_COMMENT:
                count = xmlTextWriterEndComment(writer);
                break;
            default:
                loop = 0;
                continue;
        }

        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}